

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O0

QPDFObjectHandle
do_with_oh<QPDFObjectHandle>
          (qpdf_data qpdf,qpdf_oh oh,function<QPDFObjectHandle_()> *fallback,
          function<QPDFObjectHandle_(QPDFObjectHandle_&)> *fn)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  function<QPDFObjectHandle_(QPDFObjectHandle_&)> *in_R8;
  QPDFObjectHandle QVar1;
  anon_class_40_2_fa08e0b4 local_98;
  function<QPDFObjectHandle_(_qpdf_data_*)> local_70;
  function<QPDFObjectHandle_(_qpdf_data_*)> local_50;
  function<QPDFObjectHandle_(QPDFObjectHandle_&)> *fn_local;
  function<QPDFObjectHandle_()> *fallback_local;
  function<QPDFObjectHandle_()> *pfStack_18;
  qpdf_oh oh_local;
  qpdf_data qpdf_local;
  
  fallback_local._4_4_ = (qpdf_oh)fallback;
  fn_local = fn;
  pfStack_18 = (function<QPDFObjectHandle_()> *)CONCAT44(in_register_00000034,oh);
  qpdf_local = qpdf;
  std::function<QPDFObjectHandle_()>::function
            ((function<QPDFObjectHandle_()> *)&local_50,(function<QPDFObjectHandle_()> *)fn);
  std::function<QPDFObjectHandle_(QPDFObjectHandle_&)>::function(&local_98.fn,in_R8);
  local_98.oh = fallback_local._4_4_;
  std::function<QPDFObjectHandle(_qpdf_data*)>::
  function<do_with_oh<QPDFObjectHandle>(_qpdf_data*,unsigned_int,std::function<QPDFObjectHandle()>,std::function<QPDFObjectHandle(QPDFObjectHandle&)>)::_lambda(_qpdf_data*)_1_,void>
            ((function<QPDFObjectHandle(_qpdf_data*)> *)&local_70,&local_98);
  trap_oh_errors<QPDFObjectHandle>
            (qpdf,(function<QPDFObjectHandle_()> *)CONCAT44(in_register_00000034,oh),&local_50);
  std::function<QPDFObjectHandle_(_qpdf_data_*)>::~function(&local_70);
  do_with_oh<QPDFObjectHandle>(_qpdf_data*,unsigned_int,std::function<QPDFObjectHandle()>,std::function<QPDFObjectHandle(QPDFObjectHandle&)>)
  ::{lambda(_qpdf_data*)#1}::~function((_lambda__qpdf_data___1_ *)&local_98);
  std::function<QPDFObjectHandle_()>::~function((function<QPDFObjectHandle_()> *)&local_50);
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)qpdf;
  return (QPDFObjectHandle)
         QVar1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static RET
do_with_oh(
    qpdf_data qpdf,
    qpdf_oh oh,
    std::function<RET()> fallback,
    std::function<RET(QPDFObjectHandle&)> fn)
{
    return trap_oh_errors<RET>(qpdf, fallback, [fn, oh](qpdf_data q) {
        auto i = q->oh_cache.find(oh);
        bool result = ((i != q->oh_cache.end()) && (i->second).get());
        if (!result) {
            QTC::TC("qpdf", "qpdf-c invalid object handle");
            throw QPDFExc(
                qpdf_e_internal,
                q->qpdf->getFilename(),
                std::string("C API object handle ") + std::to_string(oh),
                0,
                "attempted access to unknown object handle");
        }
        return fn(*(q->oh_cache[oh]));
    });
}